

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O1

void av1_write_obu_tg_tile_headers
               (AV1_COMP *cpi,MACROBLOCKD *xd,PackBSParams *pack_bs_params,int tile_idx)

{
  _Bool _Var1;
  byte bVar2;
  int iVar3;
  byte *pbVar4;
  uint32_t uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  aom_write_bit_buffer local_40;
  
  iVar8 = (cpi->common).tiles.cols;
  iVar9 = (cpi->common).tiles.rows;
  iVar3 = cpi->num_tg;
  _Var1 = ((cpi->common).seq_params)->has_nonzero_operating_point_idc;
  bVar2 = pack_bs_params->obu_extn_header;
  pbVar4 = pack_bs_params->tile_data_curr;
  if ((iVar3 == 1) && ((cpi->ppi->level_params).keep_level_stats != 0)) {
    cpi->frame_header_count = cpi->frame_header_count + 1;
  }
  *pbVar4 = (iVar3 == 1) << 4 | _Var1 * '\x04' | 0x22;
  uVar6 = 1;
  if (_Var1 != false) {
    pbVar4[1] = bVar2;
    uVar6 = 2;
  }
  pack_bs_params->curr_tg_hdr_size = uVar6;
  pack_bs_params->obu_header_size = uVar6;
  if (cpi->num_tg == 1) {
    uVar5 = write_frame_header_obu
                      (cpi,xd,pack_bs_params->saved_wb,pack_bs_params->tile_data_curr + uVar6,0);
    pack_bs_params->curr_tg_hdr_size = pack_bs_params->curr_tg_hdr_size + uVar5;
  }
  iVar7 = (cpi->common).tiles.rows * (cpi->common).tiles.cols;
  iVar8 = (iVar8 * iVar9 + iVar3 + -1) / iVar3 + tile_idx;
  if (iVar8 < iVar7) {
    iVar7 = iVar8;
  }
  local_40.bit_buffer = pack_bs_params->tile_data_curr + pack_bs_params->curr_tg_hdr_size;
  iVar8 = cpi->num_tg;
  iVar9 = (cpi->common).tiles.log2_cols + (cpi->common).tiles.log2_rows;
  local_40.bit_offset = 0;
  if (iVar9 == 0) {
    uVar5 = 0;
  }
  else {
    aom_wb_write_bit(&local_40,(uint)(1 < iVar8));
    if (1 < iVar8) {
      aom_wb_write_literal(&local_40,tile_idx,iVar9);
      aom_wb_write_literal(&local_40,iVar7 + -1,iVar9);
    }
    uVar5 = aom_wb_bytes_written(&local_40);
  }
  iVar8 = uVar5 + pack_bs_params->curr_tg_hdr_size;
  pack_bs_params->curr_tg_hdr_size = iVar8;
  *pack_bs_params->total_size = *pack_bs_params->total_size + iVar8;
  return;
}

Assistant:

void av1_write_obu_tg_tile_headers(AV1_COMP *const cpi, MACROBLOCKD *const xd,
                                   PackBSParams *const pack_bs_params,
                                   const int tile_idx) {
  AV1_COMMON *const cm = &cpi->common;
  const CommonTileParams *const tiles = &cm->tiles;
  int *const curr_tg_hdr_size = &pack_bs_params->curr_tg_hdr_size;
  const int tg_size =
      (tiles->rows * tiles->cols + cpi->num_tg - 1) / cpi->num_tg;

  // Write Tile group, frame and OBU header
  // A new tile group begins at this tile.  Write the obu header and
  // tile group header
  const OBU_TYPE obu_type = (cpi->num_tg == 1) ? OBU_FRAME : OBU_TILE_GROUP;
  *curr_tg_hdr_size = av1_write_obu_header(
      &cpi->ppi->level_params, &cpi->frame_header_count, obu_type,
      cm->seq_params->has_nonzero_operating_point_idc,
      /*is_layer_specific_obu=*/true, pack_bs_params->obu_extn_header,
      pack_bs_params->tile_data_curr);
  pack_bs_params->obu_header_size = *curr_tg_hdr_size;

  if (cpi->num_tg == 1)
    *curr_tg_hdr_size += write_frame_header_obu(
        cpi, xd, pack_bs_params->saved_wb,
        pack_bs_params->tile_data_curr + *curr_tg_hdr_size, 0);
  *curr_tg_hdr_size += write_tile_group_header(
      pack_bs_params->tile_data_curr + *curr_tg_hdr_size, tile_idx,
      AOMMIN(tile_idx + tg_size - 1, tiles->cols * tiles->rows - 1),
      (tiles->log2_rows + tiles->log2_cols), cpi->num_tg > 1);
  *pack_bs_params->total_size += *curr_tg_hdr_size;
}